

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

bool __thiscall reflection::KeyValue::Verify(KeyValue *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  String *pSVar3;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      pSVar3 = (String *)0x0;
    }
    else {
      pSVar3 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar3);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1
       )) {
      if (*(ushort *)(this + -(long)*(int *)this) < 7) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (6 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        pSVar3 = (String *)0x0;
      }
      else {
        pSVar3 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar3);
      if (bVar1) {
        verifier->depth_ = verifier->depth_ - 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_KEY) &&
           verifier.VerifyString(key()) &&
           VerifyOffset(verifier, VT_VALUE) &&
           verifier.VerifyString(value()) &&
           verifier.EndTable();
  }